

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(data_view *data,DataType baseType,string *val)

{
  helics *phVar1;
  long lVar2;
  int64_t val_00;
  vector<double,_std::allocator<double>_> *val_01;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_02;
  NamedPoint *point;
  undefined4 in_register_00000034;
  double val_03;
  complex<double> cVar3;
  NamedPoint npv;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_60;
  string local_30;
  
  phVar1 = (helics *)CONCAT44(in_register_00000034,baseType);
  if (0x22 < (uint)(baseType + HELICS_DOUBLE)) {
    if (baseType != HELICS_ANY) {
      return;
    }
switchD_0020b3c0_caseD_0:
    local_60._0_16_ =
         (undefined1  [16])
         ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)val,(basic_string_view<char,_std::char_traits<char>_> *)&local_60._M_first)
    ;
    return;
  }
  lVar2 = (long)&switchD_0020b3c0::switchdataD_00368330 +
          (long)(int)(&switchD_0020b3c0::switchdataD_00368330)[(uint)(baseType + HELICS_DOUBLE)];
  switch(baseType) {
  case HELICS_STRING:
  case HELICS_BOOL:
  case HELICS_CHAR:
    goto switchD_0020b3c0_caseD_0;
  case HELICS_DOUBLE:
    val_03 = ValueConverter<double>::interpret(data);
    helicsDoubleString_abi_cxx11_((string *)&local_60._M_first,phVar1,val_03);
    break;
  case HELICS_INT:
  case HELICS_TIME:
    phVar1 = (helics *)ValueConverter<long>::interpret(data);
    helicsIntString_abi_cxx11_((string *)&local_60._M_first,phVar1,val_00);
    break;
  case HELICS_COMPLEX:
    cVar3 = ValueConverter<std::complex<double>_>::interpret(data);
    cVar3._M_value._0_8_ = cVar3._M_value._8_8_;
    cVar3._M_value._8_8_ = lVar2;
    helicsComplexString_abi_cxx11_((string *)&local_60._M_first,phVar1,cVar3);
    break;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)&local_30,data);
    helicsVectorString_abi_cxx11_((string *)&local_60._M_first,(helics *)&local_30,val_01);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_60._M_first);
    std::__cxx11::string::~string((string *)&local_60._M_first);
    CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_30);
    return;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_30,data
             );
    helicsComplexVectorString_abi_cxx11_((string *)&local_60._M_first,(helics *)&local_30,val_02);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_60._M_first);
    std::__cxx11::string::~string((string *)&local_60._M_first);
    CLI::std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::
    ~_Vector_base((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                  &local_30);
    return;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)&local_60._M_first,data);
    if (NAN((double)local_60._32_8_)) {
      std::__cxx11::string::string
                ((string *)&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_60._M_first);
    }
    else {
      helicsNamedPointString_abi_cxx11_(&local_30,(helics *)&local_60._M_first,point);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (val,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    goto LAB_0020b50a;
  default:
    goto switchD_0020b3c0_caseD_a;
  case HELICS_JSON:
    readJsonValue_abi_cxx11_
              ((defV *)&local_60._M_first,(helics *)data,
               (data_view *)&switchD_0020b3c0::switchdataD_00368330);
    valueExtract((defV *)&local_60._M_first,val);
    CLI::std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)&local_60._M_first);
    return;
  case HELICS_UNKNOWN:
  case HELICS_CUSTOM:
  case HELICS_MULTI:
    data_view::string_abi_cxx11_((string *)&local_60._M_first,data);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_60._M_first);
LAB_0020b50a:
  std::__cxx11::string::~string((string *)&local_60._M_first);
switchD_0020b3c0_caseD_a:
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::string& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val = helicsDoubleString(value);
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val = helicsIntString(value);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        case DataType::HELICS_BOOL:
        case DataType::HELICS_ANY:
            val = ValueConverter<std::string_view>::interpret(data);
            break;
        case DataType::HELICS_UNKNOWN:
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            val = data.string();
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npv = ValueConverter<NamedPoint>::interpret(data);
            val = std::isnan(npv.value) ? npv.name : helicsNamedPointString(npv);
            break;
        }
        case DataType::HELICS_VECTOR:
            val = helicsVectorString(ValueConverter<std::vector<double>>::interpret(data));
            break;
        case DataType::HELICS_COMPLEX:
            val = helicsComplexString(ValueConverter<std::complex<double>>::interpret(data));
            break;
        case DataType::HELICS_COMPLEX_VECTOR:
            val = helicsComplexVectorString(
                ValueConverter<std::vector<std::complex<double>>>::interpret(data));
            break;
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}